

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_std::create_formatting
                 (locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  char *pcVar1;
  locale *this;
  utf8_moneypunct_from_wide<false> *__f;
  base_num_format<char> *this_00;
  void *refs;
  int in_ECX;
  locale *in_RDX;
  utf8_numpunct_from_wide *in_RSI;
  _Impl *in_RDI;
  int in_R8D;
  size_t in_stack_00000070;
  locale *in_stack_00000078;
  utf8_moneypunct_from_wide<false> *in_stack_00000080;
  locale tmp_2;
  locale base_2;
  locale tmp_1;
  locale base_1;
  locale tmp;
  locale base;
  locale *tmp_3;
  size_t in_stack_fffffffffffffe38;
  base_num_format<char> *in_stack_fffffffffffffe40;
  locale *in_stack_fffffffffffffe48;
  locale *this_01;
  utf8_time_put_from_wide *in_stack_fffffffffffffe50;
  utf8_moneypunct_from_wide<false> *in_stack_fffffffffffffe60;
  locale *in_stack_fffffffffffffe68;
  locale *this_02;
  string *in_stack_fffffffffffffe70;
  locale *in_stack_fffffffffffffe78;
  locale local_c8;
  undefined1 local_b9;
  locale local_b8;
  undefined1 local_a9;
  locale local_a8;
  locale local_a0;
  locale local_98;
  locale local_90;
  locale local_88;
  locale local_80;
  locale local_78;
  locale local_70;
  locale local_68;
  locale local_60;
  locale local_58;
  locale local_50;
  locale local_48 [3];
  locale local_30;
  locale local_28;
  
  if (in_ECX == 1) {
    if (in_R8D == 3) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::locale::locale(&local_28,pcVar1);
      operator_new(0x18);
      utf8_time_put_from_wide::utf8_time_put_from_wide
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (size_t)in_stack_fffffffffffffe40);
      std::locale::locale<booster::locale::impl_std::utf8_time_put_from_wide>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_time_put_from_wide *)in_stack_fffffffffffffe60);
      operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(in_RSI,in_RDX,CONCAT44(in_ECX,in_R8D));
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_numpunct_from_wide *)in_stack_fffffffffffffe60);
      std::locale::operator=(&local_30,local_48);
      std::locale::~locale(local_48);
      operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide
                ((utf8_moneypunct_from_wide<true> *)in_stack_00000080,in_stack_00000078,
                 in_stack_00000070);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_moneypunct_from_wide<true> *)in_stack_fffffffffffffe60);
      std::locale::operator=(&local_30,&local_50);
      std::locale::~locale(&local_50);
      operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide
                (in_stack_00000080,in_stack_00000078,in_stack_00000070);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 in_stack_fffffffffffffe60);
      std::locale::operator=(&local_30,&local_58);
      std::locale::~locale(&local_58);
      operator_new(0x10);
      util::base_num_format<char>::base_num_format
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::locale::locale<booster::locale::util::base_num_format<char>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (base_num_format<char> *)in_stack_fffffffffffffe60);
      std::locale::~locale(&local_30);
      std::locale::~locale(&local_28);
    }
    else if (in_R8D == 1) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::locale::locale(&local_60,pcVar1);
      operator_new(0x18);
      time_put_from_base<char>::time_put_from_base
                ((time_put_from_base<char> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (size_t)in_stack_fffffffffffffe40);
      std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (time_put_from_base<char> *)in_stack_fffffffffffffe60);
      operator_new(0x18);
      std::__cxx11::string::c_str();
      utf8_numpunct::utf8_numpunct
                ((utf8_numpunct *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
                 (size_t)in_stack_fffffffffffffe40);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_numpunct *)in_stack_fffffffffffffe60);
      std::locale::operator=(&local_68,&local_70);
      std::locale::~locale(&local_70);
      operator_new(0x18);
      std::__cxx11::string::c_str();
      utf8_moneypunct<true>::utf8_moneypunct
                ((utf8_moneypunct<true> *)in_stack_fffffffffffffe50,
                 (char *)in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<true>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_moneypunct<true> *)in_stack_fffffffffffffe60);
      std::locale::operator=(&local_68,&local_78);
      std::locale::~locale(&local_78);
      operator_new(0x18);
      std::__cxx11::string::c_str();
      utf8_moneypunct<false>::utf8_moneypunct
                ((utf8_moneypunct<false> *)in_stack_fffffffffffffe50,
                 (char *)in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<false>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_moneypunct<false> *)in_stack_fffffffffffffe60);
      std::locale::operator=(&local_68,&local_80);
      std::locale::~locale(&local_80);
      operator_new(0x10);
      util::base_num_format<char>::base_num_format
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::locale::locale<booster::locale::util::base_num_format<char>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (base_num_format<char> *)in_stack_fffffffffffffe60);
      std::locale::~locale(&local_68);
      std::locale::~locale(&local_60);
    }
    else if (in_R8D == 2) {
      pcVar1 = (char *)std::__cxx11::string::c_str();
      std::locale::locale(&local_88,pcVar1);
      operator_new(0x18);
      time_put_from_base<char>::time_put_from_base
                ((time_put_from_base<char> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (size_t)in_stack_fffffffffffffe40);
      std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (time_put_from_base<char> *)in_stack_fffffffffffffe60);
      operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(in_RSI,in_RDX,CONCAT44(in_ECX,in_R8D));
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (utf8_numpunct_from_wide *)in_stack_fffffffffffffe60);
      this_02 = &local_98;
      std::locale::operator=(&local_90,this_02);
      std::locale::~locale(this_02);
      this = (locale *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide
                ((utf8_moneypunct_from_wide<true> *)in_stack_00000080,in_stack_00000078,
                 in_stack_00000070);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (this,this_02,(utf8_moneypunct_from_wide<true> *)in_stack_fffffffffffffe60);
      std::locale::operator=(&local_90,&local_a0);
      std::locale::~locale(&local_a0);
      __f = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide
                (in_stack_00000080,in_stack_00000078,in_stack_00000070);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (this,this_02,__f);
      this_01 = &local_a8;
      std::locale::operator=(&local_90,this_01);
      std::locale::~locale(this_01);
      operator_new(0x10);
      util::base_num_format<char>::base_num_format
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::locale::locale<booster::locale::util::base_num_format<char>>
                (this,this_02,(base_num_format<char> *)__f);
      std::locale::~locale(&local_90);
      std::locale::~locale(&local_88);
    }
    else {
      local_a9 = 0;
      create_basic_formatting<char>(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      this_00 = (base_num_format<char> *)operator_new(0x10);
      util::base_num_format<char>::base_num_format(this_00,in_stack_fffffffffffffe38);
      std::locale::locale<booster::locale::util::base_num_format<char>>
                ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (base_num_format<char> *)in_stack_fffffffffffffe60);
      std::locale::operator=((locale *)in_RDI,&local_b8);
      std::locale::~locale(&local_b8);
    }
  }
  else if (in_ECX == 2) {
    local_b9 = 0;
    create_basic_formatting<wchar_t>(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    refs = operator_new(0x10);
    util::base_num_format<wchar_t>::base_num_format
              ((base_num_format<wchar_t> *)in_stack_fffffffffffffe40,(size_t)refs);
    std::locale::locale<booster::locale::util::base_num_format<wchar_t>>
              ((locale *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (base_num_format<wchar_t> *)in_stack_fffffffffffffe60);
    std::locale::operator=((locale *)in_RDI,&local_c8);
    std::locale::~locale(&local_c8);
  }
  else {
    std::locale::locale((locale *)in_RDI,(locale *)in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_formatting(  std::locale const &in,
                                std::string const &locale_name,
                                character_facet_type type,
                                utf8_support utf)
{
        switch(type) {
        case char_facet: 
            {
                if(utf == utf8_from_wide ) {
                    std::locale base = std::locale(locale_name.c_str());
                    
                    std::locale tmp = std::locale(in,new utf8_time_put_from_wide(base));
                    tmp = std::locale(tmp,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else if(utf == utf8_native) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new time_put_from_base<char>(base));
                    tmp = std::locale(tmp,new utf8_numpunct(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<true>(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<false>(locale_name.c_str()));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else if(utf == utf8_native_with_wide) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new time_put_from_base<char>(base));
                    tmp = std::locale(tmp,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else
                {
                    std::locale tmp = create_basic_formatting<char>(in,locale_name);
                    tmp = std::locale(tmp,new util::base_num_format<char>());
                    return tmp;
                }
            }
        case wchar_t_facet:
            {
                std::locale tmp = create_basic_formatting<wchar_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<wchar_t>());
                return tmp;
            }
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            {
                std::locale tmp = create_basic_formatting<char16_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<char16_t>());
                return tmp;
            }
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            {
                std::locale tmp = create_basic_formatting<char32_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<char32_t>());
                return tmp;
            }
        #endif
        default:
            return in;
        }
}